

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

RecyclableObject *
TTD::NSSnapObjects::DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo
          (SnapObject *snpObject,InflateMap *inflator)

{
  bool bVar1;
  SnapPromiseAllResolveElementFunctionInfo *capabilityInfo;
  ScriptContext *ctx;
  JavascriptPromiseCapability *capabilities;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *pJVar2;
  RecyclableObject *pRVar3;
  
  capabilityInfo =
       SnapObjectGetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)31>
                 (snpObject);
  ctx = InflateMap::LookupScriptContext(inflator,snpObject->SnapType->ScriptContextLogId);
  capabilities = NSSnapValues::InflatePromiseCapabilityInfo
                           (&capabilityInfo->Capabilities,ctx,inflator);
  bVar1 = InflateMap::
          IsPromiseInfoDefined<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
                    (inflator,capabilityInfo->RemainingElementsWrapperId);
  if (!bVar1) {
    pJVar2 = Js::JavascriptLibrary::CreateRemainingElementsWrapper_TTD
                       ((ctx->super_ScriptContextBase).javascriptLibrary,ctx,
                        capabilityInfo->RemainingElementsValue);
    InflateMap::
    AddInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
              (inflator,capabilityInfo->RemainingElementsWrapperId,pJVar2);
  }
  pJVar2 = InflateMap::
           LookupInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
                     (inflator,capabilityInfo->RemainingElementsWrapperId);
  pRVar3 = InflateMap::LookupObject(inflator,capabilityInfo->Values);
  pRVar3 = Js::JavascriptLibrary::CreatePromiseAllResolveElementFunction_TTD
                     ((ctx->super_ScriptContextBase).javascriptLibrary,capabilities,
                      capabilityInfo->Index,pJVar2,pRVar3,capabilityInfo->AlreadyCalled);
  return pRVar3;
}

Assistant:

Js::RecyclableObject* DoObjectInflation_SnapPromiseAllResolveElementFunctionInfo(const SnapObject* snpObject, InflateMap* inflator)
        {
            const SnapPromiseAllResolveElementFunctionInfo* aInfo = SnapObjectGetAddtlInfoAs<SnapPromiseAllResolveElementFunctionInfo*, SnapObjectType::SnapPromiseAllResolveElementFunctionObject>(snpObject);
            Js::ScriptContext* ctx = inflator->LookupScriptContext(snpObject->SnapType->ScriptContextLogId);

            Js::JavascriptPromiseCapability* capabilities = InflatePromiseCapabilityInfo(&aInfo->Capabilities, ctx, inflator);

            if (!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId))
            {
                Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingWrapper = ctx->GetLibrary()->CreateRemainingElementsWrapper_TTD(ctx, aInfo->RemainingElementsValue);
                inflator->AddInflatedPromiseInfo(aInfo->RemainingElementsWrapperId, remainingWrapper);
            }
            Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* wrapper = inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>(aInfo->RemainingElementsWrapperId);

            Js::RecyclableObject* values = inflator->LookupObject(aInfo->Values);

            return ctx->GetLibrary()->CreatePromiseAllResolveElementFunction_TTD(capabilities, aInfo->Index, wrapper, values, aInfo->AlreadyCalled);
        }